

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

tm * __thiscall
spdlog::pattern_formatter::get_time_
          (tm *__return_storage_ptr__,pattern_formatter *this,log_msg *msg)

{
  time_t local_28;
  time_t local_20;
  log_msg *local_18;
  log_msg *msg_local;
  pattern_formatter *this_local;
  
  local_18 = msg;
  msg_local = (log_msg *)this;
  if (this->pattern_time_type_ == local) {
    local_20 = std::chrono::_V2::system_clock::to_time_t(&msg->time);
    details::os::localtime((os *)__return_storage_ptr__,&local_20);
  }
  else {
    local_28 = std::chrono::_V2::system_clock::to_time_t(&msg->time);
    details::os::gmtime((os *)__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tm get_time_(const details::log_msg &msg)
    {
        if (pattern_time_type_ == pattern_time_type::local)
        {
            return details::os::localtime(log_clock::to_time_t(msg.time));
        }
        return details::os::gmtime(log_clock::to_time_t(msg.time));
    }